

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currpinf.cpp
# Opt level: O2

void __thiscall icu_63::CurrencyPluralInfo::deleteHash(CurrencyPluralInfo *this,Hashtable *hTable)

{
  UHashElement *pUVar1;
  int32_t *p;
  int32_t pos;
  int32_t local_14;
  
  if (hTable != (Hashtable *)0x0) {
    while( true ) {
      p = &local_14;
      pUVar1 = Hashtable::nextElement(hTable,&local_14);
      if (pUVar1 == (UHashElement *)0x0) break;
      if ((long *)(pUVar1->value).pointer != (long *)0x0) {
        (**(code **)(*(pUVar1->value).pointer + 8))();
      }
    }
    Hashtable::~Hashtable(hTable);
    UMemory::operator_delete((UMemory *)hTable,p);
  }
  return;
}

Assistant:

void
CurrencyPluralInfo::deleteHash(Hashtable* hTable) {
    if ( hTable == nullptr ) {
        return;
    }
    int32_t pos = UHASH_FIRST;
    const UHashElement* element = nullptr;
    while ( (element = hTable->nextElement(pos)) != nullptr ) {
        const UHashTok valueTok = element->value;
        const UnicodeString* value = (UnicodeString*)valueTok.pointer;
        delete value;
    }
    delete hTable;
    hTable = nullptr;
}